

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O2

bool __thiscall SQArray::Remove(SQArray *this,SQInteger idx)

{
  bool bVar1;
  
  bVar1 = idx < (long)(this->_values)._size;
  if (bVar1 && -1 < idx) {
    sqvector<SQObjectPtr>::remove(&this->_values,(char *)idx);
    ShrinkIfNeeded(this);
  }
  return bVar1 && -1 < idx;
}

Assistant:

bool Remove(SQInteger idx){
        if(idx < 0 || idx >= (SQInteger)_values.size())
            return false;
        _values.remove(idx);
        ShrinkIfNeeded();
        return true;
    }